

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

string * __thiscall Json::Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 extraout_RAX;
  char *pcVar4;
  char *__s;
  ostringstream oss;
  string local_1a8;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  size_t sVar3;
  
  switch((char)*(ushort *)&this->field_0x8) {
  case '\x01':
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x12cff0);
    return __return_storage_ptr__;
  case '\x02':
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x12cff0);
    return __return_storage_ptr__;
  case '\x03':
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)this,(this->value_).real_);
    return __return_storage_ptr__;
  case '\x04':
    __s = (this->value_).string_;
    if ((uint *)__s != (uint *)0x0) {
      if ((*(ushort *)&this->field_0x8 >> 8 & 1) == 0) {
        sVar3 = strlen(__s);
        uVar2 = (uint)sVar3;
      }
      else {
        uVar2 = *(uint *)__s;
        __s = (char *)((long)__s + 4);
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (char *)((ulong)uVar2 + (long)__s);
      break;
    }
  case '\0':
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = "";
    __s = "";
    break;
  case '\x05':
    bVar1 = (this->value_).bool_;
    __s = "false";
    if ((ulong)bVar1 != 0) {
      __s = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (char *)(((ulong)bVar1 ^ 5) + (long)__s);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"Type is not convertible to string",0x21);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream(local_188);
    std::ios_base::~ios_base(local_118);
    _Unwind_Resume(extraout_RAX);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string Value::asString() const {
  switch (type_) {
  case nullValue:
    return "";
  case stringValue:
  {
    if (value_.string_ == 0) return "";
    unsigned this_len;
    char const* this_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    return std::string(this_str, this_len);
  }
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}